

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O3

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
          (CircularArray<(anonymous_namespace)::TestObject,_2UL> *this)

{
  size_type sVar1;
  long lVar2;
  int iVar3;
  
  sVar1 = this->size_;
  iVar3 = ::(anonymous_namespace)::TestObject::destruct_count;
  while (::(anonymous_namespace)::TestObject::destruct_count = iVar3, sVar1 != 0) {
    pop_back(this);
    iVar3 = ::(anonymous_namespace)::TestObject::destruct_count;
    sVar1 = this->size_;
  }
  lVar2 = 0x18;
  do {
    if (*(char *)((long)(this->contents_)._M_elems + lVar2 + -4) == '\0') {
      iVar3 = iVar3 + 1;
      ::(anonymous_namespace)::TestObject::destruct_count = iVar3;
    }
    lVar2 = lVar2 + -0xc;
  } while (lVar2 != 0);
  return;
}

Assistant:

~CircularArray() { clear(); }